

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

mchunkptr try_realloc_chunk(mstate m,mchunkptr p,size_t nb,int can_move)

{
  size_t sVar1;
  malloc_tree_chunk *pmVar2;
  malloc_tree_chunk *pmVar3;
  int iVar4;
  ulong uVar5;
  tbinptr pmVar6;
  mchunkptr pmVar7;
  ulong uVar8;
  ulong uVar9;
  ulong psize;
  bool bVar10;
  mchunkptr r_2;
  size_t newsize_2;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F_1;
  tchunkptr R;
  tchunkptr XP;
  tchunkptr TP;
  bindex_t I;
  mchunkptr B;
  mchunkptr F;
  size_t rsize_1;
  size_t nextsize;
  size_t newsize_1;
  mchunkptr n;
  mchunkptr r_1;
  size_t dsize;
  size_t dvs;
  mchunkptr newtop;
  size_t newtopsize;
  size_t newsize;
  mchunkptr r;
  size_t rsize;
  mchunkptr next;
  size_t oldsize;
  mchunkptr newp;
  int can_move_local;
  size_t nb_local;
  mchunkptr p_local;
  mstate m_local;
  
  uVar5 = p->head & 0xfffffffffffffff8;
  pmVar6 = (tbinptr)((long)&p->prev_foot + uVar5);
  bVar10 = false;
  if ((((mchunkptr)m->least_addr <= p) && (bVar10 = false, (p->head & 3) != 1)) &&
     (bVar10 = false, p < pmVar6)) {
    bVar10 = (pmVar6->head & 1) != 0;
  }
  if (!bVar10) {
    abort();
  }
  if ((p->head & 3) == 0) {
    pmVar7 = mmap_resize(m,p,nb,can_move);
    return pmVar7;
  }
  if (nb <= uVar5) {
    uVar5 = uVar5 - nb;
    if (uVar5 < 0x20) {
      return p;
    }
    pmVar7 = (mchunkptr)((long)&p->prev_foot + nb);
    p->head = p->head & 1 | nb | 2;
    *(ulong *)((long)&p->head + nb) = *(ulong *)((long)&p->head + nb) | 1;
    pmVar7->head = pmVar7->head & 1 | uVar5 | 2;
    *(ulong *)((long)pmVar7 + uVar5 + 8) = *(ulong *)((long)pmVar7 + uVar5 + 8) | 1;
    dispose_chunk(m,pmVar7,uVar5);
    return p;
  }
  if (pmVar6 == (tbinptr)m->top) {
    if (uVar5 + m->topsize <= nb) {
      return (mchunkptr)0x0;
    }
    uVar5 = (uVar5 + m->topsize) - nb;
    pmVar7 = (mchunkptr)((long)&p->prev_foot + nb);
    p->head = p->head & 1 | nb | 2;
    *(ulong *)((long)&p->head + nb) = *(ulong *)((long)&p->head + nb) | 1;
    pmVar7->head = uVar5 | 1;
    m->top = pmVar7;
    m->topsize = uVar5;
    return p;
  }
  if (pmVar6 == (tbinptr)m->dv) {
    sVar1 = m->dvsize;
    if (uVar5 + sVar1 < nb) {
      return (mchunkptr)0x0;
    }
    uVar8 = (uVar5 + sVar1) - nb;
    if (0x1f < uVar8) {
      pmVar7 = (mchunkptr)((long)&p->prev_foot + nb);
      p->head = p->head & 1 | nb | 2;
      *(ulong *)((long)&p->head + nb) = *(ulong *)((long)&p->head + nb) | 1;
      pmVar7->head = uVar8 | 1;
      *(ulong *)((long)pmVar7 + uVar8) = uVar8;
      *(ulong *)((long)pmVar7 + uVar8 + 8) =
           *(ulong *)((long)pmVar7 + uVar8 + 8) & 0xfffffffffffffffe;
      m->dvsize = uVar8;
      m->dv = pmVar7;
      return p;
    }
    uVar5 = uVar5 + sVar1;
    p->head = p->head & 1 | uVar5 | 2;
    *(ulong *)((long)&p->head + uVar5) = *(ulong *)((long)&p->head + uVar5) | 1;
    m->dvsize = 0;
    m->dv = (mchunkptr)0x0;
    return p;
  }
  if ((pmVar6->head & 2) != 0) {
    return (mchunkptr)0x0;
  }
  uVar8 = pmVar6->head;
  uVar9 = uVar8 & 0xfffffffffffffff8;
  if (uVar5 + uVar9 < nb) {
    return (mchunkptr)0x0;
  }
  psize = (uVar5 + uVar9) - nb;
  if (uVar8 >> 3 < 0x20) {
    pmVar2 = pmVar6->fd;
    pmVar3 = pmVar6->bk;
    iVar4 = (int)(uVar8 >> 3);
    bVar10 = true;
    if ((pmVar2 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar4 << 1))) &&
       (bVar10 = false, (malloc_tree_chunk *)m->least_addr <= pmVar2)) {
      bVar10 = pmVar2->bk == pmVar6;
    }
    if (!bVar10) {
      abort();
    }
    if (pmVar3 == pmVar2) {
      m->smallmap = (1 << ((byte)(uVar8 >> 3) & 0x1f) ^ 0xffffffffU) & m->smallmap;
    }
    else {
      bVar10 = true;
      if ((pmVar3 != (malloc_tree_chunk *)(m->smallbins + (uint)(iVar4 << 1))) &&
         (bVar10 = false, (malloc_tree_chunk *)m->least_addr <= pmVar3)) {
        bVar10 = pmVar3->fd == pmVar6;
      }
      if (!bVar10) {
        abort();
      }
      pmVar2->bk = pmVar3;
      pmVar3->fd = pmVar2;
    }
    goto LAB_0010b69f;
  }
  pmVar2 = pmVar6->parent;
  if (pmVar6->bk == pmVar6) {
    CP = pmVar6->child + 1;
    F_1 = pmVar6->child[1];
    if (F_1 == (malloc_tree_chunk *)0x0) {
      CP = pmVar6->child;
      F_1 = pmVar6->child[0];
      if (F_1 == (malloc_tree_chunk *)0x0) goto LAB_0010b4e1;
    }
    while( true ) {
      H = F_1->child + 1;
      bVar10 = true;
      if (F_1->child[1] == (malloc_tree_chunk *)0x0) {
        H = F_1->child;
        bVar10 = F_1->child[0] != (malloc_tree_chunk *)0x0;
      }
      if (!bVar10) break;
      CP = H;
      F_1 = *H;
    }
    if (CP < m->least_addr) {
      abort();
    }
    *CP = (tchunkptr)0x0;
  }
  else {
    pmVar3 = pmVar6->fd;
    F_1 = pmVar6->bk;
    bVar10 = false;
    if (((malloc_tree_chunk *)m->least_addr <= pmVar3) && (bVar10 = false, pmVar3->bk == pmVar6)) {
      bVar10 = F_1->fd == pmVar6;
    }
    if (!bVar10) {
      abort();
    }
    pmVar3->bk = F_1;
    F_1->fd = pmVar3;
  }
LAB_0010b4e1:
  if (pmVar2 != (malloc_tree_chunk *)0x0) {
    if (pmVar6 == m->treebins[pmVar6->index]) {
      m->treebins[pmVar6->index] = F_1;
      if (F_1 == (tchunkptr)0x0) {
        m->treemap = (1 << ((byte)pmVar6->index & 0x1f) ^ 0xffffffffU) & m->treemap;
      }
    }
    else {
      if (pmVar2 < (malloc_tree_chunk *)m->least_addr) {
        abort();
      }
      if (pmVar2->child[0] == pmVar6) {
        pmVar2->child[0] = F_1;
      }
      else {
        pmVar2->child[1] = F_1;
      }
    }
    if (F_1 != (tchunkptr)0x0) {
      if (F_1 < (tchunkptr)m->least_addr) {
        abort();
      }
      F_1->parent = pmVar2;
      pmVar2 = pmVar6->child[0];
      if (pmVar2 != (malloc_tree_chunk *)0x0) {
        if (pmVar2 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F_1->child[0] = pmVar2;
        pmVar2->parent = F_1;
      }
      pmVar2 = pmVar6->child[1];
      if (pmVar2 != (malloc_tree_chunk *)0x0) {
        if (pmVar2 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F_1->child[1] = pmVar2;
        pmVar2->parent = F_1;
      }
    }
  }
LAB_0010b69f:
  if (psize < 0x20) {
    uVar5 = uVar5 + uVar9;
    p->head = p->head & 1 | uVar5 | 2;
    *(ulong *)((long)&p->head + uVar5) = *(ulong *)((long)&p->head + uVar5) | 1;
  }
  else {
    pmVar7 = (mchunkptr)((long)&p->prev_foot + nb);
    p->head = p->head & 1 | nb | 2;
    *(ulong *)((long)&p->head + nb) = *(ulong *)((long)&p->head + nb) | 1;
    pmVar7->head = pmVar7->head & 1 | psize | 2;
    *(ulong *)((long)pmVar7 + psize + 8) = *(ulong *)((long)pmVar7 + psize + 8) | 1;
    dispose_chunk(m,pmVar7,psize);
  }
  return p;
}

Assistant:

static mchunkptr try_realloc_chunk(mstate m, mchunkptr p, size_t nb,
                                   int can_move) {
  mchunkptr newp = 0;
  size_t oldsize = chunksize(p);
  mchunkptr next = chunk_plus_offset(p, oldsize);
  if (RTCHECK(ok_address(m, p) && ok_inuse(p) &&
              ok_next(p, next) && ok_pinuse(next))) {
    if (is_mmapped(p)) {
      newp = mmap_resize(m, p, nb, can_move);
    }
    else if (oldsize >= nb) {             /* already big enough */
      size_t rsize = oldsize - nb;
      if (rsize >= MIN_CHUNK_SIZE) {      /* split off remainder */
        mchunkptr r = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        set_inuse(m, r, rsize);
        dispose_chunk(m, r, rsize);
      }
      newp = p;
    }
    else if (next == m->top) {  /* extend into top */
      if (oldsize + m->topsize > nb) {
        size_t newsize = oldsize + m->topsize;
        size_t newtopsize = newsize - nb;
        mchunkptr newtop = chunk_plus_offset(p, nb);
        set_inuse(m, p, nb);
        newtop->head = newtopsize |PINUSE_BIT;
        m->top = newtop;
        m->topsize = newtopsize;
        newp = p;
      }
    }
    else if (next == m->dv) { /* extend into dv */
      size_t dvs = m->dvsize;
      if (oldsize + dvs >= nb) {
        size_t dsize = oldsize + dvs - nb;
        if (dsize >= MIN_CHUNK_SIZE) {
          mchunkptr r = chunk_plus_offset(p, nb);
          mchunkptr n = chunk_plus_offset(r, dsize);
          set_inuse(m, p, nb);
          set_size_and_pinuse_of_free_chunk(r, dsize);
          clear_pinuse(n);
          m->dvsize = dsize;
          m->dv = r;
        }
        else { /* exhaust dv */
          size_t newsize = oldsize + dvs;
          set_inuse(m, p, newsize);
          m->dvsize = 0;
          m->dv = 0;
        }
        newp = p;
      }
    }
    else if (!cinuse(next)) { /* extend into next free chunk */
      size_t nextsize = chunksize(next);
      if (oldsize + nextsize >= nb) {
        size_t rsize = oldsize + nextsize - nb;
        unlink_chunk(m, next, nextsize);
        if (rsize < MIN_CHUNK_SIZE) {
          size_t newsize = oldsize + nextsize;
          set_inuse(m, p, newsize);
        }
        else {
          mchunkptr r = chunk_plus_offset(p, nb);
          set_inuse(m, p, nb);
          set_inuse(m, r, rsize);
          dispose_chunk(m, r, rsize);
        }
        newp = p;
      }
    }
  }
  else {
    USAGE_ERROR_ACTION(m, chunk2mem(p));
  }
  return newp;
}